

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d7297f::PathSimplifier::PathSimplifier
          (PathSimplifier *this,QVectorPath *path,QDataBuffer<QPoint> *vertices,
          QDataBuffer<unsigned_int> *indices,QTransform *matrix)

{
  bool bVar1;
  ElementBlock *in_RCX;
  ElementBlock *in_RDX;
  ElementAllocator *in_RDI;
  PathSimplifier *unaff_retaddr;
  bool ok;
  QTransform *in_stack_000000e8;
  QVectorPath *in_stack_000000f0;
  PathSimplifier *in_stack_000000f8;
  PathSimplifier *in_stack_00000120;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar2;
  
  ElementAllocator::ElementAllocator(in_RDI);
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::QDataBuffer
            ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),(qsizetype)in_RDI);
  in_RDI[4].blocks = in_RDX;
  BoundingVolumeHierarchy::BoundingVolumeHierarchy((BoundingVolumeHierarchy *)(in_RDI + 5));
  in_RDI[8].blocks = in_RCX;
  QRBTree<(anonymous_namespace)::PathSimplifier::Element_*>::QRBTree
            ((QRBTree<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 9));
  QDataBuffer<QPoint>::reset((QDataBuffer<QPoint> *)in_RDI[4].blocks);
  QDataBuffer<unsigned_int>::reset((QDataBuffer<unsigned_int> *)in_RDI[8].blocks);
  bVar2 = 1;
  initElements(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  bVar1 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::isEmpty
                    ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 1));
  if (!bVar1) {
    removeIntersections(unaff_retaddr);
    bVar2 = connectElements(in_stack_00000120);
    if ((bool)bVar2) {
      fillIndices(unaff_retaddr);
    }
  }
  if ((bVar2 & 1) == 0) {
    QDataBuffer<QPoint>::reset((QDataBuffer<QPoint> *)in_RDI[4].blocks);
    QDataBuffer<unsigned_int>::reset((QDataBuffer<unsigned_int> *)in_RDI[8].blocks);
  }
  return;
}

Assistant:

PathSimplifier::PathSimplifier(const QVectorPath &path, QDataBuffer<QPoint> &vertices,
                               QDataBuffer<quint32> &indices, const QTransform &matrix)
    : m_elements(0)
    , m_points(&vertices)
    , m_indices(&indices)
{
    m_points->reset();
    m_indices->reset();
    bool ok = true;
    initElements(path, matrix);
    if (!m_elements.isEmpty()) {
        removeIntersections();
        ok = connectElements();
        if (ok)
            fillIndices();
    }
    if (!ok) {
        m_points->reset();
        m_indices->reset();
    }
}